

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

Pipeline *
buildEmptyPipelineModelWithStringOutput
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,char *outTensorName)

{
  RepeatedField<long> *this;
  ulong uVar1;
  Rep *pRVar2;
  ModelDescription *pMVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  long *plVar6;
  FeatureDescription *pFVar7;
  void *pvVar8;
  StringFeatureType *pSVar9;
  Pipeline *pPVar10;
  undefined8 *puVar11;
  uint uVar12;
  Arena *pAVar13;
  int iVar14;
  
  pMVar3 = m->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    uVar1 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar13 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar13 = *(Arena **)pAVar13;
    }
    pMVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar13);
    m->description_ = pMVar3;
  }
  pRVar2 = (pMVar3->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001dfdc5:
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pMVar3->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar8 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(pMVar3->input_).super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar14 = (pMVar3->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar14) goto LAB_001dfdc5;
    (pMVar3->input_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
    pvVar8 = pRVar2->elements[iVar14];
  }
  puVar11 = (undefined8 *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar8 + 0x10),inTensorAttr->name,puVar11);
  pFVar4 = *(FeatureType **)((long)pvVar8 + 0x20);
  if (pFVar4 == (FeatureType *)0x0) {
    pAVar13 = (Arena *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
      pAVar13 = *(Arena **)pAVar13;
    }
    pFVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar13);
    *(FeatureType **)((long)pvVar8 + 0x20) = pFVar4;
  }
  if (pFVar4->_oneof_case_[0] == 5) {
    pAVar5 = (pFVar4->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 5;
    uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
    pAVar13 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar13 = *(Arena **)pAVar13;
    }
    pAVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar13);
    (pFVar4->Type_).multiarraytype_ = pAVar5;
  }
  pAVar5->datatype_ = 0x10020;
  if (0 < inTensorAttr->dimension) {
    this = &pAVar5->shape_;
    uVar12 = (pAVar5->shape_).current_size_;
    iVar14 = 0;
    do {
      if (uVar12 == (pAVar5->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(this,uVar12 + 1);
        plVar6 = google::protobuf::RepeatedField<long>::elements(this);
        plVar6[uVar12] = 1;
      }
      else {
        plVar6 = google::protobuf::RepeatedField<long>::elements(this);
        plVar6[uVar12] = 1;
      }
      uVar12 = uVar12 + 1;
      this->current_size_ = uVar12;
      iVar14 = iVar14 + 1;
    } while (iVar14 < inTensorAttr->dimension);
  }
  pMVar3 = m->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    uVar1 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar13 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar13 = *(Arena **)pAVar13;
    }
    pMVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar13);
    m->description_ = pMVar3;
  }
  pRVar2 = (pMVar3->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar14 = (pMVar3->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar14 < pRVar2->allocated_size) {
      (pMVar3->output_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
      pvVar8 = pRVar2->elements[iVar14];
      goto LAB_001dff44;
    }
  }
  pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                     ((pMVar3->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar8 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pMVar3->output_).super_RepeatedPtrFieldBase,pFVar7);
LAB_001dff44:
  puVar11 = (undefined8 *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar8 + 0x10),outTensorName,puVar11);
  pFVar4 = *(FeatureType **)((long)pvVar8 + 0x20);
  if (pFVar4 == (FeatureType *)0x0) {
    pAVar13 = (Arena *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
      pAVar13 = *(Arena **)pAVar13;
    }
    pFVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar13);
    *(FeatureType **)((long)pvVar8 + 0x20) = pFVar4;
  }
  if (pFVar4->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 3;
    uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
    pAVar13 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar13 = *(Arena **)pAVar13;
    }
    pSVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                       (pAVar13);
    (pFVar4->Type_).stringtype_ = pSVar9;
  }
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] == 0xca) {
    pPVar10 = (Pipeline *)(m->Type_).pipelineclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 0xca;
    uVar1 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar13 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar13 = *(Arena **)pAVar13;
    }
    pPVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Pipeline>(pAVar13);
    (m->Type_).pipeline_ = pPVar10;
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
  }
  return pPVar10;
}

Assistant:

Specification::Pipeline* buildEmptyPipelineModelWithStringOutput(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const char *outTensorName) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorName);
    outTensor->mutable_type()->mutable_stringtype();
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto pipeline = m.mutable_pipeline();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return pipeline;
}